

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
google::protobuf::internal::GenerateEnumData
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          internal *this,Span<const_int> values)

{
  int *piVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  reference piVar5;
  Nullable<const_char_*> pcVar6;
  uint *puVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  pointer piVar12;
  pointer piVar13;
  vector<int,_std::allocator<int>_> *this_00;
  size_type i;
  pointer piVar14;
  optional<short> start_sequence;
  uint32_t sequence_length;
  vector<int,_std::allocator<int>_> fallback_values;
  ulong local_e0;
  vector<int,_std::allocator<int>_> fallback_values_after_bitmap;
  int32_t v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bitmap_values;
  anon_class_16_2_ef8d1931 adjust;
  vector<int,_std::allocator<int>_> fallback_values_too_large;
  Span<const_int> values_local;
  
  values_local.len_ = (size_type)values.ptr_;
  i = 0;
  values_local.ptr_ = (pointer)this;
  while( true ) {
    uVar8 = i + 1;
    if (values_local.len_ <= uVar8) break;
    piVar5 = absl::lts_20250127::Span<const_int>::operator[](&values_local,i);
    iVar2 = *piVar5;
    piVar5 = absl::lts_20250127::Span<const_int>::operator[](&values_local,uVar8);
    i = uVar8;
    if (*piVar5 <= iVar2) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&adjust,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                 ,0x6a,"sorted_and_unique()");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&adjust);
    }
  }
  fallback_values_too_large.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fallback_values_too_large.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fallback_values_too_large.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  start_sequence.super__Optional_base<short,_true,_true>._M_payload.
  super__Optional_payload_base<short>._M_engaged = false;
  sequence_length = 0;
  piVar1 = values_local.ptr_ + values_local.len_;
  for (piVar14 = values_local.ptr_; this_00 = &fallback_values_too_large, piVar14 != piVar1;
      piVar14 = piVar14 + 1) {
    v = *piVar14;
    if (start_sequence.super__Optional_base<short,_true,_true>._M_payload.
        super__Optional_payload_base<short>._M_engaged == false) {
      if ((short)v == v) {
        start_sequence.super__Optional_base<short,_true,_true>._M_payload.
        super__Optional_payload_base<short>._M_engaged = true;
        sequence_length = 1;
        start_sequence.super__Optional_base<short,_true,_true>._M_payload.
        super__Optional_payload_base<short>._M_payload._M_value = (short)v;
      }
      else {
        std::vector<int,_std::allocator<int>_>::push_back(this_00,&v);
      }
    }
    else if ((sequence_length < 0xffff) &&
            (v == (int)start_sequence.super__Optional_base<short,_true,_true>._M_payload.
                       super__Optional_payload_base<short>._M_payload._M_value + sequence_length)) {
      sequence_length = sequence_length + 1;
    }
    else {
      adjust.start_sequence = &start_sequence;
      adjust.sequence_length = &sequence_length;
      uVar3 = GenerateEnumData::anon_class_16_2_ef8d1931::operator()(&adjust,v);
      uVar11 = (ulong)uVar3;
      uVar8 = ((long)bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start) * 8;
      if (uVar8 < uVar11 || uVar8 - uVar11 == 0) {
        if (uVar3 < 0xffe0) {
          uVar8 = (long)bitmap_values.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)bitmap_values.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2;
          piVar12 = (pointer)(uVar11 + 0x20 >> 5);
          if (piVar12 <=
              (pointer)(((long)fallback_values_after_bitmap.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)fallback_values_after_bitmap.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2) + uVar8 + 1)) {
            fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = piVar12;
            local_e0 = uVar8;
            pcVar6 = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_long,unsigned_long>
                               ((unsigned_long *)&fallback_values,&local_e0,
                                "rounded_bitmap_size > bitmap_values.size()");
            if (pcVar6 != (Nullable<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&fallback_values,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                         ,0xa9,pcVar6);
              goto LAB_0024b3da;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      (&bitmap_values,(size_type)piVar12);
            piVar12 = fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            for (piVar13 = fallback_values_after_bitmap.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar13 != piVar12;
                piVar13 = piVar13 + 1) {
              uVar4 = GenerateEnumData::anon_class_16_2_ef8d1931::operator()(&adjust,*piVar13);
              bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4 >> 5] =
                   bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar4 >> 5] | 1 << ((byte)uVar4 & 0x1f);
            }
            if (fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            puVar7 = (uint *)((ulong)(uVar3 >> 3 & 0xfffffffc) +
                             (long)bitmap_values.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
            goto LAB_0024b166;
          }
        }
        std::vector<int,_std::allocator<int>_>::push_back(&fallback_values_after_bitmap,&v);
      }
      else {
        fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)fallback_values_after_bitmap.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)fallback_values_after_bitmap.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2);
        local_e0 = local_e0 & 0xffffffff00000000;
        pcVar6 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,int>
                           ((unsigned_long *)&fallback_values,(int *)&local_e0,
                            "fallback_values_after_bitmap.size() == 0");
        if (pcVar6 != (Nullable<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&fallback_values,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                     ,0x98,pcVar6);
LAB_0024b3da:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&fallback_values);
        }
        puVar7 = (uint *)((ulong)(uVar3 >> 3 & 0xfffffffc) +
                         (long)bitmap_values.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start);
LAB_0024b166:
        *puVar7 = *puVar7 | 1 << ((byte)uVar3 & 0x1f);
      }
    }
  }
  fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = &fallback_values_after_bitmap;
    if (fallback_values_too_large.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        fallback_values_too_large.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<int,_std::allocator<int>_>::resize
                (&fallback_values,
                 ((long)fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) +
                 ((long)fallback_values_too_large.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)fallback_values_too_large.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2));
      std::
      __merge<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,__gnu_cxx::__ops::_Iter_less_iter>
                (fallback_values_too_large.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 fallback_values_too_large.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      goto LAB_0024b208;
    }
  }
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&fallback_values,this_00);
LAB_0024b208:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             ((long)bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) +
             ((long)fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) + 2,(allocator_type *)&adjust);
  puVar7 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  adjust.start_sequence = (optional<short> *)CONCAT44(adjust.start_sequence._4_4_,sequence_length);
  local_e0._0_2_ = (ushort)sequence_length;
  pcVar6 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_short>
                     ((uint *)&adjust,(unsigned_short *)&local_e0,
                      "sequence_length == static_cast<uint16_t>(sequence_length)");
  if (pcVar6 == (Nullable<const_char_*>)0x0) {
    uVar10 = 0;
    if (start_sequence.super__Optional_base<short,_true,_true>._M_payload.
        super__Optional_payload_base<short>._M_engaged != false) {
      uVar10 = (uint)(ushort)start_sequence.super__Optional_base<short,_true,_true>._M_payload.
                             super__Optional_payload_base<short>._M_payload._M_value;
    }
    *puVar7 = sequence_length << 0x10 | uVar10;
    adjust.start_sequence =
         (optional<short> *)
         (((long)bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start) * 8);
    local_e0._0_2_ =
         (ushort)((int)((long)bitmap_values.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)bitmap_values.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) << 3) & 0xffe0;
    pcVar6 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_short>
                       ((unsigned_long *)&adjust,(unsigned_short *)&local_e0,
                        "kBitmapBlockSize * bitmap_values.size() == static_cast<uint16_t>(kBitmapBlockSize * bitmap_values.size())"
                       );
    if (pcVar6 == (Nullable<const_char_*>)0x0) {
      adjust.start_sequence =
           (optional<short> *)
           ((long)fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2);
      local_e0._0_2_ = (ushort)adjust.start_sequence;
      pcVar6 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_short>
                         ((unsigned_long *)&adjust,(unsigned_short *)&local_e0,
                          "fallback_values.size() == static_cast<uint16_t>(fallback_values.size())")
      ;
      piVar12 = fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pcVar6 == (Nullable<const_char_*>)0x0) {
        lVar9 = (long)fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        puVar7[1] = ((uint)lVar9 & 0xfffffffc) << 0xe |
                    ((int)bitmap_values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (int)bitmap_values.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) * 8 & 0xffffffe0U;
        if ((long)bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          memmove(puVar7 + 2,
                  bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                  (long)bitmap_values.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)bitmap_values.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
          lVar9 = (long)fallback_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar12;
        }
        adjust.sequence_length = (uint32_t *)(lVar9 >> 2);
        adjust.start_sequence = (optional<short> *)piVar12;
        EytzingerLayoutSorter::Sort((EytzingerLayoutSorter *)&adjust,0);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&fallback_values.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&bitmap_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&fallback_values_after_bitmap.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&fallback_values_too_large.super__Vector_base<int,_std::allocator<int>_>);
        return __return_storage_ptr__;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&adjust,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                 ,0xcf,pcVar6);
    }
    else {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&adjust,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
                 ,0xcd,pcVar6);
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&adjust,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util.cc"
               ,200,pcVar6);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&adjust);
}

Assistant:

std::vector<uint32_t> GenerateEnumData(absl::Span<const int32_t> values) {
  const auto sorted_and_unique = [&] {
    for (size_t i = 0; i + 1 < values.size(); ++i) {
      if (values[i] >= values[i + 1]) return false;
    }
    return true;
  };
  ABSL_DCHECK(sorted_and_unique());
  std::vector<int32_t> fallback_values_too_large, fallback_values_after_bitmap;
  std::vector<uint32_t> bitmap_values;
  constexpr size_t kBitmapBlockSize = 32;
  absl::optional<int16_t> start_sequence;
  uint32_t sequence_length = 0;
  for (int32_t v : values) {
    // If we don't yet have a sequence, start it.
    if (!start_sequence.has_value()) {
      // But only if we can fit it in the sequence.
      if (static_cast<int16_t>(v) != v) {
        fallback_values_too_large.push_back(v);
        continue;
      }

      start_sequence = v;
      sequence_length = 1;
      continue;
    }
    // If we can extend the sequence, do so.
    if (v == static_cast<int32_t>(*start_sequence) +
                 static_cast<int32_t>(sequence_length) &&
        sequence_length < 0xFFFF) {
      ++sequence_length;
      continue;
    }

    // We adjust the bitmap values to be relative to the end of the sequence.
    const auto adjust = [&](int32_t v) -> uint32_t {
      // Cast to int64_t first to avoid overflow. The result is guaranteed to be
      // positive and fit in uint32_t.
      int64_t a = static_cast<int64_t>(v) - *start_sequence - sequence_length;
      ABSL_DCHECK(a >= 0);
      ABSL_DCHECK_EQ(a, static_cast<uint32_t>(a));
      return a;
    };
    const uint32_t adjusted = adjust(v);

    const auto add_bit = [&](uint32_t bit) {
      bitmap_values[bit / kBitmapBlockSize] |= uint32_t{1}
                                               << (bit % kBitmapBlockSize);
    };

    // If we can fit it on the already allocated bitmap, do so.
    if (adjusted < kBitmapBlockSize * bitmap_values.size()) {
      // We can fit it in the existing bitmap.
      ABSL_DCHECK_EQ(fallback_values_after_bitmap.size(), 0);
      add_bit(adjusted);
      continue;
    }

    // We can't fit in the sequence and we can't fit in the current bitmap.
    // Evaluate if it is better to add to fallback, or to collapse all the
    // fallback values after the bitmap into the bitmap.
    const size_t cost_if_fallback =
        bitmap_values.size() + (1 + fallback_values_after_bitmap.size());
    const size_t rounded_bitmap_size =
        (adjusted + kBitmapBlockSize) / kBitmapBlockSize;
    const size_t cost_if_collapse = rounded_bitmap_size;

    if (cost_if_collapse <= cost_if_fallback &&
        kBitmapBlockSize * rounded_bitmap_size < 0x10000) {
      // Collapse the existing values, and add the new one.
      ABSL_DCHECK_GT(rounded_bitmap_size, bitmap_values.size());
      bitmap_values.resize(rounded_bitmap_size);
      for (int32_t to_collapse : fallback_values_after_bitmap) {
        add_bit(adjust(to_collapse));
      }
      fallback_values_after_bitmap.clear();
      add_bit(adjusted);
    } else {
      fallback_values_after_bitmap.push_back(v);
    }
  }

  std::vector<int32_t> fallback_values;
  if (fallback_values_after_bitmap.empty()) {
    fallback_values = std::move(fallback_values_too_large);
  } else if (fallback_values_too_large.empty()) {
    fallback_values = std::move(fallback_values_after_bitmap);
  } else {
    fallback_values.resize(fallback_values_too_large.size() +
                           fallback_values_after_bitmap.size());
    std::merge(fallback_values_too_large.begin(),
               fallback_values_too_large.end(),
               fallback_values_after_bitmap.begin(),
               fallback_values_after_bitmap.end(), &fallback_values[0]);
  }

  std::vector<uint32_t> output(
      2 /* seq start + seq len + bitmap len + ordered len */ +
      bitmap_values.size() + fallback_values.size());
  uint32_t* p = output.data();

  ABSL_DCHECK_EQ(sequence_length, static_cast<uint16_t>(sequence_length));
  *p++ = uint32_t{static_cast<uint16_t>(start_sequence.value_or(0))} |
         (uint32_t{sequence_length} << 16);
  ABSL_DCHECK_EQ(
      kBitmapBlockSize * bitmap_values.size(),
      static_cast<uint16_t>(kBitmapBlockSize * bitmap_values.size()));
  ABSL_DCHECK_EQ(fallback_values.size(),
                 static_cast<uint16_t>(fallback_values.size()));
  *p++ = static_cast<uint32_t>(kBitmapBlockSize * bitmap_values.size()) |
         static_cast<uint32_t>(fallback_values.size() << 16);
  p = std::copy(bitmap_values.begin(), bitmap_values.end(), p);

  EytzingerLayoutSorter{fallback_values,
                        absl::MakeSpan(p, fallback_values.size())}
      .Sort();

  return output;
}